

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O1

void duckdb::ComputeDerivatives
               (vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true> *states,
               vector<unsigned_long,_true> *res,vector<double,_true> *der,idx_t n)

{
  value_type vVar1;
  TemporaryMemoryState *pTVar2;
  __int_type _Var3;
  const_reference pvVar4;
  const_reference pvVar5;
  long lVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double local_88;
  
  if (n == 0) {
    local_88 = 0.0;
    dVar21 = 1.0;
    dVar14 = 1.0;
  }
  else {
    local_88 = 0.0;
    dVar21 = 1.0;
    sVar9 = 0;
    dVar14 = 1.0;
    do {
      pvVar4 = vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true>::operator[]
                         (states,sVar9);
      pTVar2 = pvVar4->_M_data;
      pvVar5 = vector<unsigned_long,_true>::operator[](res,sVar9);
      vVar1 = *pvVar5;
      auVar17._8_4_ = (int)(vVar1 >> 0x20);
      auVar17._0_8_ = vVar1;
      auVar17._12_4_ = 0x45300000;
      _Var3 = (pTVar2->remaining_size).super___atomic_base<unsigned_long>._M_i;
      lVar6 = _Var3 + (_Var3 == 0);
      auVar19._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar19._0_8_ = lVar6;
      auVar19._12_4_ = 0x45300000;
      dVar13 = (auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      dVar10 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
      _Var3 = (pTVar2->materialization_penalty).super___atomic_base<unsigned_long>._M_i;
      auVar20._8_4_ = (int)(_Var3 >> 0x20);
      auVar20._0_8_ = _Var3;
      auVar20._12_4_ = 0x45300000;
      dVar21 = dVar21 * dVar13;
      dVar14 = dVar14 * dVar10;
      local_88 = local_88 +
                 (1.0 - dVar13 / dVar10) *
                 ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_Var3) - 4503599627370496.0));
      sVar9 = sVar9 + 1;
    } while (n != sVar9);
  }
  auVar11._8_4_ = (int)(n >> 0x20);
  auVar11._0_8_ = n;
  auVar11._12_4_ = 0x45300000;
  dVar18 = (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0);
  dVar13 = 1.0 / dVar18;
  dVar10 = pow(dVar21 / dVar14,dVar13);
  dVar21 = pow(dVar21,dVar13);
  dVar14 = pow(dVar14,dVar13);
  if (n != 0) {
    auVar16._0_8_ = (local_88 * -dVar21) / (dVar14 * dVar18);
    sVar9 = 0;
    do {
      pvVar4 = vector<std::reference_wrapper<const_duckdb::TemporaryMemoryState>,_true>::operator[]
                         (states,sVar9);
      pTVar2 = pvVar4->_M_data;
      pvVar5 = vector<unsigned_long,_true>::operator[](res,sVar9);
      _Var3 = (pTVar2->remaining_size).super___atomic_base<unsigned_long>._M_i;
      uVar7 = _Var3 + (_Var3 == 0);
      _Var3 = (pTVar2->materialization_penalty).super___atomic_base<unsigned_long>._M_i;
      auVar15._8_4_ = (int)(_Var3 >> 0x20);
      auVar15._0_8_ = _Var3;
      auVar15._12_4_ = 0x45300000;
      auVar12._0_8_ =
           ((double)(*pvVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(*pvVar5 & 0xffffffff | 0x4330000000000000);
      auVar12._8_8_ =
           ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uVar7 & 0xffffffff | 0x4330000000000000);
      auVar16._8_8_ =
           ((auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)_Var3) - 4503599627370496.0)) * (1.0 - dVar10);
      auVar17 = divpd(auVar16,auVar12);
      pvVar8 = vector<double,_true>::operator[](der,sVar9);
      *pvVar8 = auVar17._0_8_ - auVar17._8_8_;
      sVar9 = sVar9 + 1;
    } while (n != sVar9);
  }
  return;
}

Assistant:

static void ComputeDerivatives(const vector<reference<const TemporaryMemoryState>> &states, const vector<idx_t> &res,
                               vector<double> &der, const idx_t n) {
	// Cost function takes "throughput" (reservation / size) of each operator as its principal input
	double prod_siz = 1;
	double prod_res = 1;
	double mat_cost = 0;
	for (idx_t i = 0; i < n; i++) {
		auto &state = states[i].get();
		const auto resd = static_cast<double>(res[i]);
		const auto sizd = static_cast<double>(MaxValue<idx_t>(state.GetRemainingSize(), 1));
		const auto pend = static_cast<double>(state.GetMaterializationPenalty());
		prod_res *= resd;
		prod_siz *= sizd;
		mat_cost += pend * (1 - resd / sizd); // Materialization cost: sum of (1 - throughput)
	}
	const double nd = static_cast<double>(n);                    // n as double for convenience
	const double tp_mult = 1 - pow(prod_res / prod_siz, 1 / nd); // Throughput multiplier: 1 - geomean throughputs

	// Cost function: materialization cost * (1 - throughput multiplier), but we don't actually need to compute it
	// here. We need to compute the derivative with respect to every reservation, stored in "der"
	// Just use https://www.derivative-calculator.net with this (n = 3) to see what's going on
	// (3 - (a_1/s_1)-(a_2/s_2)-(a_3/s_3))*(1-((a_1/s_1)*(a_2/s_2)*(a_3/s_3))^(1/3))
	const double intermediate = -(pow(prod_res, 1 / nd) * mat_cost) / (nd * pow(prod_siz, 1 / nd));
	for (idx_t i = 0; i < n; i++) {
		auto &state = states[i].get();
		const auto resd = static_cast<double>(res[i]);
		const auto sizd = static_cast<double>(MaxValue<idx_t>(state.GetRemainingSize(), 1));
		const auto pend = static_cast<double>(state.GetMaterializationPenalty());
		der[i] = intermediate / resd - pend * tp_mult / sizd;
	}
}